

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-h2-proxy.c
# Opt level: O0

ssize_t cf_h2_proxy_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,CURLcode *err)

{
  uint uVar1;
  cf_h2_proxy_ctx *ctx_00;
  undefined8 uVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  CURLcode CVar6;
  uint uVar7;
  int32_t iVar8;
  int32_t iVar9;
  long lVar10;
  size_t sVar11;
  size_t sVar12;
  undefined8 in_stack_ffffffffffffff08;
  undefined4 uVar13;
  undefined8 in_stack_ffffffffffffff10;
  undefined4 uVar14;
  size_t rwin;
  int blocked;
  CURLcode result;
  ssize_t nwritten;
  int rv;
  cf_call_data save;
  cf_h2_proxy_ctx *ctx;
  CURLcode *err_local;
  size_t len_local;
  void *buf_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  uVar14 = (undefined4)((ulong)in_stack_ffffffffffffff10 >> 0x20);
  uVar13 = (undefined4)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  ctx_00 = (cf_h2_proxy_ctx *)cf->ctx;
  if ((ctx_00->tunnel).state != H2_TUNNEL_ESTABLISHED) {
    *err = CURLE_SEND_ERROR;
    return -1;
  }
  uVar2 = *(undefined8 *)((long)cf->ctx + 8);
  *(Curl_easy **)((long)cf->ctx + 8) = data;
  if (((byte)(ctx_00->tunnel).field_0xa4 >> 1 & 1) == 0) {
    if ((ctx_00->tunnel).upload_blocked_len == 0) {
      _blocked = Curl_bufq_write(&(ctx_00->tunnel).sendbuf,(uchar *)buf,len,err);
      if ((long)_blocked < 0) {
        if (*err != CURLE_AGAIN) goto LAB_00186234;
        _blocked = 0;
      }
    }
    else {
      if (len < (ctx_00->tunnel).upload_blocked_len) {
        Curl_failf(data,"HTTP/2 proxy, send again with decreased length");
        *err = CURLE_HTTP2;
        _blocked = 0xffffffffffffffff;
        goto LAB_00186234;
      }
      _blocked = (ctx_00->tunnel).upload_blocked_len;
      (ctx_00->tunnel).upload_blocked_len = 0;
      *err = CURLE_OK;
    }
    _Var4 = Curl_bufq_is_empty(&(ctx_00->tunnel).sendbuf);
    if (!_Var4) {
      iVar5 = nghttp2_session_resume_data(ctx_00->h2,(ctx_00->tunnel).stream_id);
      iVar5 = nghttp2_is_fatal(iVar5);
      if (iVar5 != 0) {
        *err = CURLE_SEND_ERROR;
        _blocked = 0xffffffffffffffff;
        goto LAB_00186234;
      }
    }
    CVar6 = proxy_h2_progress_ingress(cf,data);
    if (CVar6 == CURLE_OK) {
      CVar6 = proxy_h2_progress_egress(cf,data);
      if (CVar6 == CURLE_AGAIN) {
        bVar3 = true;
      }
      else {
        if (CVar6 != CURLE_OK) {
          *err = CVar6;
          _blocked = 0xffffffffffffffff;
          goto LAB_00186234;
        }
        _Var4 = Curl_bufq_is_empty(&(ctx_00->tunnel).sendbuf);
        bVar3 = !_Var4;
      }
      if (bVar3) {
        iVar8 = nghttp2_session_get_stream_remote_window_size(ctx_00->h2,(ctx_00->tunnel).stream_id)
        ;
        lVar10 = (long)iVar8;
        if (((lVar10 == 0) && (data != (Curl_easy *)0x0)) &&
           (((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0 &&
            ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))))) {
          Curl_trc_cf_infof(data,cf,"[%d] remote flow window is exhausted",
                            (ulong)(uint)(ctx_00->tunnel).stream_id);
        }
        (ctx_00->tunnel).upload_blocked_len = _blocked;
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0))
            && (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
          uVar1 = (ctx_00->tunnel).stream_id;
          uVar7 = nghttp2_session_get_remote_window_size(ctx_00->h2);
          Curl_trc_cf_infof(data,cf,"[%d] cf_send(len=%zu) BLOCK: win %u/%zu blocked_len=%zu",
                            (ulong)uVar1,len,(ulong)uVar7,lVar10,_blocked);
          uVar14 = (undefined4)(_blocked >> 0x20);
          uVar13 = (undefined4)((ulong)lVar10 >> 0x20);
        }
        drain_tunnel(cf,data,&ctx_00->tunnel);
        *err = CURLE_AGAIN;
        _blocked = 0xffffffffffffffff;
      }
      else {
        iVar5 = proxy_h2_should_close_session(ctx_00);
        if (iVar5 != 0) {
          if (((byte)(ctx_00->tunnel).field_0xa4 >> 1 & 1) == 0) {
            if ((((data != (Curl_easy *)0x0) &&
                 ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
                (cf != (Curl_cfilter *)0x0)) && (0 < cf->cft->log_level)) {
              Curl_trc_cf_infof(data,cf,"[0] send: nothing to do in this session");
            }
            *err = CURLE_HTTP2;
          }
          else {
            *err = CURLE_SEND_ERROR;
          }
          _blocked = 0xffffffffffffffff;
        }
      }
    }
    else {
      *err = CVar6;
      _blocked = 0xffffffffffffffff;
    }
  }
  else {
    _blocked = 0xffffffffffffffff;
    *err = CURLE_SEND_ERROR;
  }
LAB_00186234:
  _Var4 = Curl_bufq_is_empty(&(ctx_00->tunnel).recvbuf);
  if ((!_Var4) && ((-1 < (long)_blocked || (*err == CURLE_AGAIN)))) {
    drain_tunnel(cf,data,&ctx_00->tunnel);
  }
  if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ba >> 0x1c & 1) != 0)) &&
     ((cf != (Curl_cfilter *)0x0 && (0 < cf->cft->log_level)))) {
    uVar1 = (ctx_00->tunnel).stream_id;
    CVar6 = *err;
    iVar8 = nghttp2_session_get_stream_remote_window_size(ctx_00->h2,(ctx_00->tunnel).stream_id);
    iVar9 = nghttp2_session_get_remote_window_size(ctx_00->h2);
    sVar11 = Curl_bufq_len(&(ctx_00->tunnel).sendbuf);
    sVar12 = Curl_bufq_len(&ctx_00->outbufq);
    Curl_trc_cf_infof(data,cf,
                      "[%d] cf_send(len=%zu) -> %zd, %d, h2 windows %d-%d (stream-conn), buffers %zu-%zu (stream-conn)"
                      ,(ulong)uVar1,len,_blocked,CONCAT44(uVar13,CVar6),CONCAT44(uVar14,iVar8),iVar9
                      ,sVar11,sVar12);
  }
  *(undefined8 *)((long)cf->ctx + 8) = uVar2;
  return _blocked;
}

Assistant:

static ssize_t cf_h2_proxy_send(struct Curl_cfilter *cf,
                                struct Curl_easy *data,
                                const void *buf, size_t len, CURLcode *err)
{
  struct cf_h2_proxy_ctx *ctx = cf->ctx;
  struct cf_call_data save;
  int rv;
  ssize_t nwritten;
  CURLcode result;
  int blocked = 0;

  if(ctx->tunnel.state != H2_TUNNEL_ESTABLISHED) {
    *err = CURLE_SEND_ERROR;
    return -1;
  }
  CF_DATA_SAVE(save, cf, data);

  if(ctx->tunnel.closed) {
    nwritten = -1;
    *err = CURLE_SEND_ERROR;
    goto out;
  }
  else if(ctx->tunnel.upload_blocked_len) {
    /* the data in `buf` has already been submitted or added to the
     * buffers, but have been EAGAINed on the last invocation. */
    DEBUGASSERT(len >= ctx->tunnel.upload_blocked_len);
    if(len < ctx->tunnel.upload_blocked_len) {
      /* Did we get called again with a smaller `len`? This should not
       * happen. We are not prepared to handle that. */
      failf(data, "HTTP/2 proxy, send again with decreased length");
      *err = CURLE_HTTP2;
      nwritten = -1;
      goto out;
    }
    nwritten = (ssize_t)ctx->tunnel.upload_blocked_len;
    ctx->tunnel.upload_blocked_len = 0;
    *err = CURLE_OK;
  }
  else {
    nwritten = Curl_bufq_write(&ctx->tunnel.sendbuf, buf, len, err);
    if(nwritten < 0) {
      if(*err != CURLE_AGAIN)
        goto out;
      nwritten = 0;
    }
  }

  if(!Curl_bufq_is_empty(&ctx->tunnel.sendbuf)) {
    /* req body data is buffered, resume the potentially suspended stream */
    rv = nghttp2_session_resume_data(ctx->h2, ctx->tunnel.stream_id);
    if(nghttp2_is_fatal(rv)) {
      *err = CURLE_SEND_ERROR;
      nwritten = -1;
      goto out;
    }
  }

  result = proxy_h2_progress_ingress(cf, data);
  if(result) {
    *err = result;
    nwritten = -1;
    goto out;
  }

  /* Call the nghttp2 send loop and flush to write ALL buffered data,
   * headers and/or request body completely out to the network */
  result = proxy_h2_progress_egress(cf, data);
  if(result == CURLE_AGAIN) {
    blocked = 1;
  }
  else if(result) {
    *err = result;
    nwritten = -1;
    goto out;
  }
  else if(!Curl_bufq_is_empty(&ctx->tunnel.sendbuf)) {
    /* although we wrote everything that nghttp2 wants to send now,
     * there is data left in our stream send buffer unwritten. This may
     * be due to the stream's HTTP/2 flow window being exhausted. */
    blocked = 1;
  }

  if(blocked) {
    /* Unable to send all data, due to connection blocked or H2 window
     * exhaustion. Data is left in our stream buffer, or nghttp2's internal
     * frame buffer or our network out buffer. */
    size_t rwin = nghttp2_session_get_stream_remote_window_size(
                    ctx->h2, ctx->tunnel.stream_id);
    if(rwin == 0) {
      /* H2 flow window exhaustion.
       * FIXME: there is no way to HOLD all transfers that use this
       * proxy connection AND to UNHOLD all of them again when the
       * window increases.
       * We *could* iterate over all data on this conn maybe? */
      CURL_TRC_CF(data, cf, "[%d] remote flow "
                  "window is exhausted", ctx->tunnel.stream_id);
    }

    /* Whatever the cause, we need to return CURL_EAGAIN for this call.
     * We have unwritten state that needs us being invoked again and EAGAIN
     * is the only way to ensure that. */
    ctx->tunnel.upload_blocked_len = nwritten;
    CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) BLOCK: win %u/%zu "
                "blocked_len=%zu",
                ctx->tunnel.stream_id, len,
                nghttp2_session_get_remote_window_size(ctx->h2), rwin,
                nwritten);
    drain_tunnel(cf, data, &ctx->tunnel);
    *err = CURLE_AGAIN;
    nwritten = -1;
    goto out;
  }
  else if(proxy_h2_should_close_session(ctx)) {
    /* nghttp2 thinks this session is done. If the stream has not been
     * closed, this is an error state for out transfer */
    if(ctx->tunnel.closed) {
      *err = CURLE_SEND_ERROR;
      nwritten = -1;
    }
    else {
      CURL_TRC_CF(data, cf, "[0] send: nothing to do in this session");
      *err = CURLE_HTTP2;
      nwritten = -1;
    }
  }

out:
  if(!Curl_bufq_is_empty(&ctx->tunnel.recvbuf) &&
     (nwritten >= 0 || *err == CURLE_AGAIN)) {
    /* data pending and no fatal error to report. Need to trigger
     * draining to avoid stalling when no socket events happen. */
    drain_tunnel(cf, data, &ctx->tunnel);
  }
  CURL_TRC_CF(data, cf, "[%d] cf_send(len=%zu) -> %zd, %d, "
              "h2 windows %d-%d (stream-conn), buffers %zu-%zu (stream-conn)",
              ctx->tunnel.stream_id, len, nwritten, *err,
              nghttp2_session_get_stream_remote_window_size(
                  ctx->h2, ctx->tunnel.stream_id),
              nghttp2_session_get_remote_window_size(ctx->h2),
              Curl_bufq_len(&ctx->tunnel.sendbuf),
              Curl_bufq_len(&ctx->outbufq));
  CF_DATA_RESTORE(cf, save);
  return nwritten;
}